

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O3

void fak_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  solver_state_a s;
  int local_120 [4];
  long local_110;
  long local_108;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  
  setup_simple_state_a(&two_dof_robot_a,local_120);
  lVar2 = (long)local_120[0];
  if (0 < lVar2) {
    lVar3 = 0;
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar2 = _two_dof_robot_c + lVar3 + 0x20;
      kca_fpk(lVar2,local_110 + lVar5);
      ga_pose_compose(local_110 + lVar5,_two_dof_robot_c + lVar3,local_108 + lVar5);
      kca_fvk(lVar2,local_f8 + lVar5);
      ga_twist_tf_ref_to_tgt(local_108 + lVar5,local_e8 + lVar5,local_f0 + lVar5);
      lVar1 = lVar5 + 0x20;
      ga_twist_accumulate(local_f0 + lVar5,local_f8 + lVar5,local_e8 + lVar1);
      kca_fak(lVar2,local_e0 + lVar5);
      kca_inertial_acceleration(lVar2,local_e8 + lVar1,local_d8 + lVar5);
      ga_acc_twist_add(local_e0 + lVar5,local_d8 + lVar5,local_d0 + lVar5);
      ga_acc_twist_tf_ref_to_tgt(local_108 + lVar5,local_b8 + lVar5,local_c8 + lVar5);
      ga_acc_twist_accumulate(local_c8 + lVar5,lVar5 + local_d0,local_b8 + lVar1);
      lVar2 = (long)local_120[0];
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x60;
      lVar5 = lVar1;
    } while (lVar4 < lVar2);
  }
  ga_acc_twist_log(lVar2 * 0x20 + local_b8);
  return;
}

Assistant:

void fak_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}